

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Close(PosixWritableFile *this)

{
  _func_int **pp_Var1;
  int iVar2;
  _func_int **in_RAX;
  Status *status;
  char *in_RSI;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  WriteUnbuffered(this,in_RSI,(size_t)(in_RSI + 8));
  in_RSI[0x10008] = '\0';
  in_RSI[0x10009] = '\0';
  in_RSI[0x1000a] = '\0';
  in_RSI[0x1000b] = '\0';
  in_RSI[0x1000c] = '\0';
  in_RSI[0x1000d] = '\0';
  in_RSI[0x1000e] = '\0';
  in_RSI[0x1000f] = '\0';
  iVar2 = close(*(int *)(in_RSI + 0x10010));
  if ((iVar2 < 0) && ((this->super_WritableFile)._vptr_WritableFile == (_func_int **)0x0)) {
    __errno_location();
    PosixError((string *)&stack0xffffffffffffffe8,(int)*(undefined8 *)(in_RSI + 0x10018));
    pp_Var1 = (this->super_WritableFile)._vptr_WritableFile;
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)local_18._M_p;
    if (pp_Var1 != (_func_int **)0x0) {
      local_18._M_p = (pointer)pp_Var1;
      operator_delete__(pp_Var1);
    }
  }
  in_RSI[0x10010] = -1;
  in_RSI[0x10011] = -1;
  in_RSI[0x10012] = -1;
  in_RSI[0x10013] = -1;
  return (Status)(char *)this;
}

Assistant:

Status Close() override {
    Status status = FlushBuffer();
    const int close_result = ::close(fd_);
    if (close_result < 0 && status.ok()) {
      status = PosixError(filename_, errno);
    }
    fd_ = -1;
    return status;
  }